

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

uint32_t __thiscall jpgd::jpeg_decoder::H2V2ConvertFiltered(jpeg_decoder *this)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint8 *puVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint8 *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint8 *puVar26;
  ulong uVar27;
  ulong uVar28;
  char *__assertion;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint8 *puVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint8 *puVar41;
  uint uVar42;
  int iVar43;
  uint local_98;
  uint local_90;
  
  uVar19 = this->m_image_y_size - this->m_total_lines_left;
  uVar13 = uVar19 & 0xf;
  uVar39 = (this->m_image_y_size >> 1) - 1;
  puVar41 = this->m_pScan_line_0;
  iVar30 = (int)(uVar19 - 1) >> 1;
  if ((int)(iVar30 + 1U) < (int)uVar39) {
    uVar39 = iVar30 + 1U;
  }
  puVar22 = this->m_pSample_buf;
  puVar26 = puVar22;
  puVar33 = puVar22;
  if ((-1 < iVar30) && (((uVar13 == 0xf || (uVar13 == 0)) && (1 < this->m_total_lines_left)))) {
    if ((int)uVar19 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73c,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (this->m_sample_buf_prev_valid == false) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73d,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    puVar26 = this->m_pSample_buf_prev;
    if (uVar13 == 0xf) {
      puVar33 = puVar26;
    }
  }
  uVar2 = (uVar19 & 8) * 0x10 + (uVar19 & 7) * 8;
  uVar24 = iVar30 * 8 & 0x38U | 0x100;
  uVar40 = (uVar39 & 7) << 3 | 0x100;
  iVar17 = this->m_image_x_size;
  uVar39 = (iVar17 >> 1) - 1;
  if ((uVar13 == 0) || (uVar13 == 0xf)) {
    uVar14 = 1;
    if (0 < iVar17) {
      lVar1 = (ulong)(uVar19 & 1) * 8;
      uVar13 = 0;
      uVar34 = 0;
      do {
        uVar21 = (uint)uVar34;
        uVar35 = (uVar21 & 7 | uVar13 & 0x40 | uVar2) + ((uint)(uVar34 >> 4) & 0xfffffff) * 0x180;
        if ((int)uVar35 < 0) goto LAB_0014f626;
        uVar23 = this->m_max_blocks_per_row * 0x40;
        if ((int)uVar23 <= (int)uVar35) goto LAB_0014f61d;
        uVar15 = (int)(uVar21 - 1) >> 1;
        uVar16 = uVar15 + 1;
        if ((int)uVar39 <= (int)(uVar15 + 1)) {
          uVar16 = uVar39;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        uVar15 = uVar15 & 7 | (uVar15 & 0xffffff8) * 0x30;
        uVar20 = uVar15 + uVar24;
        if ((int)uVar20 < 0) goto LAB_0014f626;
        if (uVar23 <= uVar20) goto LAB_0014f61d;
        uVar37 = (ulong)uVar20 | 0x40;
        if (uVar23 <= (uint)uVar37) goto LAB_0014f61d;
        uVar15 = uVar15 + uVar40;
        if ((int)uVar15 < 0) goto LAB_0014f626;
        if (uVar23 <= uVar15) goto LAB_0014f61d;
        uVar27 = (ulong)uVar15 | 0x40;
        if (uVar23 <= (uint)uVar27) goto LAB_0014f61d;
        uVar42 = uVar16 & 7 | (uVar16 & 0xffffff8) * 0x30;
        uVar16 = uVar42 + uVar24;
        if ((int)uVar16 < 0) goto LAB_0014f626;
        if (uVar23 <= uVar16) goto LAB_0014f61d;
        uVar18 = (ulong)uVar16 | 0x40;
        if (uVar23 <= (uint)uVar18) goto LAB_0014f61d;
        uVar42 = uVar42 + uVar40;
        if ((int)uVar42 < 0) goto LAB_0014f626;
        if (uVar23 <= uVar42) goto LAB_0014f61d;
        uVar28 = (ulong)uVar42 | 0x40;
        if (uVar23 <= (uint)uVar28) goto LAB_0014f61d;
        bVar3 = puVar33[uVar35];
        puVar22 = this->m_pSample_buf;
        uVar38 = (ulong)(uVar21 & 1);
        uVar21 = (uint)H2V2ConvertFiltered::s_muls[uVar19 & 1][uVar38][0];
        uVar29 = (uint)*(byte *)(lVar1 + 0x18f3b1 + uVar38 * 4);
        uVar35 = (uint)*(byte *)(lVar1 + 0x18f3b2 + uVar38 * 4);
        uVar25 = (uint)*(byte *)(lVar1 + 0x18f3b3 + uVar38 * 4);
        uVar23 = puVar22[uVar28] * uVar25 +
                 puVar26[uVar18] * uVar35 + puVar22[uVar27] * uVar29 + puVar26[uVar37] * uVar21 + 8
                 >> 4;
        iVar30 = this->m_crr[uVar23] + (uint)bVar3;
        if (iVar30 < 1) {
          iVar30 = 0;
        }
        if (0xfe < iVar30) {
          iVar30 = 0xff;
        }
        uVar21 = uVar25 * puVar22[uVar42] +
                 uVar35 * puVar26[uVar16] + uVar29 * puVar22[uVar15] + uVar21 * puVar26[uVar20] + 8
                 >> 4;
        iVar17 = (this->m_cbg[uVar21] + this->m_crg[uVar23] >> 0x10) + (uint)bVar3;
        iVar36 = (uint)bVar3 + this->m_cbb[uVar21];
        puVar41[uVar34 * 4] = (uint8)iVar30;
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        puVar41[uVar34 * 4 + 1] = (uint8)iVar17;
        if (iVar36 < 1) {
          iVar36 = 0;
        }
        if (0xfe < iVar36) {
          iVar36 = 0xff;
        }
        puVar41[uVar34 * 4 + 2] = (uint8)iVar36;
        puVar41[uVar34 * 4 + 3] = 0xff;
        uVar34 = uVar34 + 1;
        uVar13 = uVar13 + 8;
      } while ((int)uVar34 < this->m_image_x_size);
      uVar14 = 1;
    }
  }
  else {
    if ((uVar19 & 1) == 0) {
      __assert_fail("(row & 1) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x753,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((int)uVar19 >> 1 != iVar30) {
      __assert_fail("((y + 1 - 1) >> 1) == c_y0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x754,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar33 != puVar22) {
      __assert_fail("p_YSamples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x756,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar26 != puVar22) {
      __assert_fail("p_C0Samples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x757,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (0 < iVar17) {
      iVar30 = (uVar13 + 1 & 8) * 0x10 + (uVar13 + 1 & 6) * 8;
      puVar22 = this->m_pScan_line_1;
      uVar13 = 0;
      do {
        uVar21 = uVar13 & 7 | uVar13 * 8 & 0x40 | (uVar13 * 8 & 0xffffff80) * 3;
        uVar19 = uVar21 + uVar2;
        if ((int)uVar19 < 0) goto LAB_0014f626;
        uVar35 = this->m_max_blocks_per_row * 0x40;
        if ((int)uVar35 <= (int)uVar19) goto LAB_0014f61d;
        uVar21 = uVar21 + iVar30;
        if ((int)uVar21 < 0) goto LAB_0014f626;
        if (uVar35 <= uVar21) goto LAB_0014f61d;
        uVar16 = (int)(uVar13 - 1) >> 1;
        uVar23 = uVar16 + 1;
        if ((int)uVar39 <= (int)(uVar16 + 1)) {
          uVar23 = uVar39;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        uVar15 = uVar16 & 7 | (uVar16 & 0xffffff8) * 0x30;
        uVar20 = uVar15 + uVar24;
        if ((int)uVar20 < 0) goto LAB_0014f626;
        if (uVar35 <= uVar20) goto LAB_0014f61d;
        uVar34 = (ulong)uVar20 | 0x40;
        if (uVar35 <= (uint)uVar34) goto LAB_0014f61d;
        uVar15 = uVar15 + uVar40;
        if ((int)uVar15 < 0) goto LAB_0014f626;
        if (uVar35 <= uVar15) goto LAB_0014f61d;
        uVar37 = (ulong)uVar15 | 0x40;
        if (uVar35 <= (uint)uVar37) goto LAB_0014f61d;
        uVar42 = uVar23 & 7 | (uVar23 & 0xffffff8) * 0x30;
        uVar23 = uVar42 + uVar24;
        if ((int)uVar23 < 0) goto LAB_0014f626;
        if (uVar35 <= uVar23) goto LAB_0014f61d;
        uVar27 = (ulong)uVar23 | 0x40;
        if (uVar35 <= (uint)uVar27) goto LAB_0014f61d;
        uVar42 = uVar42 + uVar40;
        if ((int)uVar42 < 0) goto LAB_0014f626;
        if (uVar35 <= uVar42) goto LAB_0014f61d;
        uVar18 = (ulong)uVar42 | 0x40;
        if (uVar35 <= (uint)uVar18) goto LAB_0014f61d;
        bVar3 = puVar33[uVar19];
        bVar4 = puVar26[uVar34];
        puVar12 = this->m_pSample_buf;
        bVar5 = puVar26[uVar27];
        bVar6 = puVar12[uVar18];
        uVar19 = uVar13 & 1;
        bVar7 = H2V2ConvertFiltered::s_muls[1][uVar19][0];
        bVar8 = H2V2ConvertFiltered::s_muls[1][uVar19][2];
        uVar35 = (uint)H2V2ConvertFiltered::s_muls[1][uVar19][1];
        uVar31 = (uint)puVar12[uVar37];
        uVar25 = (uint)H2V2ConvertFiltered::s_muls[1][uVar19][3];
        uVar32 = (uint)bVar6;
        uVar29 = uVar25 * uVar32 +
                 (uint)bVar8 * (uint)bVar5 + uVar35 * uVar31 + (uint)bVar7 * (uint)bVar4 + 8 >> 4;
        iVar17 = this->m_crr[uVar29] + (uint)bVar3;
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        bVar9 = puVar12[uVar42];
        bVar10 = puVar26[uVar20];
        uVar15 = (uint)puVar12[uVar15];
        bVar11 = puVar26[uVar23];
        uVar35 = (uint)bVar8 * (uint)bVar11 + uVar35 * uVar15 + (uint)bVar7 * (uint)bVar10 +
                 uVar25 * bVar9 + 8 >> 4;
        iVar36 = (this->m_cbg[uVar35] + this->m_crg[uVar29] >> 0x10) + (uint)bVar3;
        iVar43 = (uint)bVar3 + this->m_cbb[uVar35];
        bVar3 = puVar33[uVar21];
        *puVar41 = (uint8)iVar17;
        if (iVar36 < 1) {
          iVar36 = 0;
        }
        if (0xfe < iVar36) {
          iVar36 = 0xff;
        }
        puVar41[1] = (uint8)iVar36;
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if (0xfe < iVar43) {
          iVar43 = 0xff;
        }
        puVar41[2] = (uint8)iVar43;
        puVar41[3] = 0xff;
        uVar21 = (uint)H2V2ConvertFiltered::s_muls[0][uVar19][0];
        uVar23 = (uint)H2V2ConvertFiltered::s_muls[0][uVar19][1];
        bVar7 = H2V2ConvertFiltered::s_muls[0][uVar19][2];
        bVar8 = H2V2ConvertFiltered::s_muls[0][uVar19][3];
        local_90 = (uint)bVar4;
        local_98 = (uint)bVar5;
        uVar35 = bVar7 * local_98 + uVar23 * uVar31 + uVar21 * local_90 + bVar8 * uVar32 + 8 >> 4;
        uVar19 = (uint)bVar8 * (uint)bVar9 +
                 (uint)bVar7 * (uint)bVar11 + uVar23 * uVar15 + uVar21 * bVar10 + 8 >> 4;
        iVar17 = this->m_crr[uVar35] + (uint)bVar3;
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        iVar43 = (this->m_cbg[uVar19] + this->m_crg[uVar35] >> 0x10) + (uint)bVar3;
        iVar36 = (uint)bVar3 + this->m_cbb[uVar19];
        *puVar22 = (uint8)iVar17;
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if (0xfe < iVar43) {
          iVar43 = 0xff;
        }
        puVar22[1] = (uint8)iVar43;
        if (iVar36 < 1) {
          iVar36 = 0;
        }
        if (0xfe < iVar36) {
          iVar36 = 0xff;
        }
        puVar22[2] = (uint8)iVar36;
        puVar22[3] = 0xff;
        iVar17 = this->m_image_x_size;
        if (((int)uVar13 < iVar17 + -1 & (byte)uVar13) == 1) {
          if (uVar16 != (int)uVar13 >> 1) {
            __assert_fail("c_x0 == (nx - 1) >> 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                          ,0x799,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
          }
          uVar19 = uVar13 * 8 + 8;
          uVar21 = uVar13 + 1 & 6 | uVar19 & 0x40 | (uVar19 & 0xffffff80) * 3;
          uVar19 = uVar21 + uVar2;
          if ((int)uVar19 < 0) goto LAB_0014f626;
          uVar35 = this->m_max_blocks_per_row * 0x40;
          if ((int)uVar35 <= (int)uVar19) goto LAB_0014f61d;
          uVar21 = uVar21 + iVar30;
          if ((int)uVar21 < 0) goto LAB_0014f626;
          if (uVar35 <= uVar21) goto LAB_0014f61d;
          bVar3 = puVar33[uVar19];
          uVar34 = (ulong)((bVar4 + uVar32) * 3 + (uint)bVar5 * 9 + uVar31 + 8 >> 2 & 0xffc);
          iVar17 = *(int *)((long)this->m_crr + uVar34) + (uint)bVar3;
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          bVar7 = puVar33[uVar21];
          uVar37 = (ulong)(((uint)bVar10 + (uint)bVar9) * 3 +
                           (uint)bVar11 + (uint)bVar11 * 8 + uVar15 + 8 >> 2 & 0xffc);
          iVar43 = (*(int *)((long)this->m_cbg + uVar37) + *(int *)((long)this->m_crg + uVar34) >>
                   0x10) + (uint)bVar3;
          iVar36 = (uint)bVar3 + *(int *)((long)this->m_cbb + uVar37);
          puVar41[4] = (uint8)iVar17;
          if (iVar43 < 1) {
            iVar43 = 0;
          }
          if (0xfe < iVar43) {
            iVar43 = 0xff;
          }
          puVar41[5] = (uint8)iVar43;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          if (0xfe < iVar36) {
            iVar36 = 0xff;
          }
          puVar41[6] = (uint8)iVar36;
          puVar41[7] = 0xff;
          uVar37 = (ulong)((uint)bVar4 + (bVar5 + uVar31) * 3 + uVar32 + (uint)bVar6 * 8 + 8 >> 2 &
                          0x7fc);
          uVar34 = (ulong)((uint)bVar9 + (uint)bVar9 * 8 + (uint)bVar10 + (bVar11 + uVar15) * 3 + 8
                           >> 2 & 0x7fc);
          iVar17 = *(int *)((long)this->m_crr + uVar37) + (uint)bVar7;
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          iVar36 = (*(int *)((long)this->m_cbg + uVar34) + *(int *)((long)this->m_crg + uVar37) >>
                   0x10) + (uint)bVar7;
          iVar43 = (uint)bVar7 + *(int *)((long)this->m_cbb + uVar34);
          puVar22[4] = (uint8)iVar17;
          if (iVar36 < 1) {
            iVar36 = 0;
          }
          if (0xfe < iVar36) {
            iVar36 = 0xff;
          }
          puVar22[5] = (uint8)iVar36;
          if (iVar43 < 1) {
            iVar43 = 0;
          }
          if (0xfe < iVar43) {
            iVar43 = 0xff;
          }
          puVar41 = puVar41 + 8;
          puVar22[6] = (uint8)iVar43;
          puVar22[7] = 0xff;
          puVar22 = puVar22 + 8;
          iVar17 = this->m_image_x_size;
          uVar13 = uVar13 + 1;
        }
        else {
          puVar41 = puVar41 + 4;
          puVar22 = puVar22 + 4;
        }
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < iVar17);
    }
    uVar14 = 2;
  }
  return uVar14;
LAB_0014f626:
  __assertion = "ofs >= 0";
  goto LAB_0014f62d;
LAB_0014f61d:
  __assertion = "ofs < m_max_blocks_per_row * 64";
LAB_0014f62d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.h"
                ,0x113,"int jpgd::jpeg_decoder::check_sample_buf_ofs(int) const");
}

Assistant:

uint32_t jpeg_decoder::H2V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 6;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 128 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 256;
		const int y1_base = (c_y1 & 7) * 8 + 256;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;

		static const uint8_t s_muls[2][2][4] =
		{
			{ { 1, 3, 3, 9 }, { 3, 9, 1, 3 }, },
			{ { 3, 1, 9, 3 }, { 9, 3, 3, 1 } }
		};

		if (((row & 15) >= 1) && ((row & 15) <= 14))
		{
			assert((row & 1) == 1);
			assert(((y + 1 - 1) >> 1) == c_y0);

			assert(p_YSamples == m_pSample_buf);
			assert(p_C0Samples == m_pSample_buf);

			uint8* d1 = m_pScan_line_1;
			const int y_sample_base_ofs1 = (((row + 1) & 8) ? 128 : 0) + ((row + 1) & 7) * 8;

			for (int x = 0; x < m_image_x_size; x++)
			{
				int k = (x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7);
				int y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
				int y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				{
					const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d0[0] = clamp(y_sample0 + rc);
					d0[1] = clamp(y_sample0 + gc);
					d0[2] = clamp(y_sample0 + bc);
					d0[3] = 255;

					d0 += 4;
				}

				{
					const uint8_t* pMuls = &s_muls[(row + 1) & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d1[0] = clamp(y_sample1 + rc);
					d1[1] = clamp(y_sample1 + gc);
					d1[2] = clamp(y_sample1 + bc);
					d1[3] = 255;

					d1 += 4;
				}

				if (((x & 1) == 1) && (x < m_image_x_size - 1))
				{
					const int nx = x + 1;
					assert(c_x0 == (nx - 1) >> 1);

					k = (nx >> 4) * BLOCKS_PER_MCU * 64 + ((nx & 8) ? 64 : 0) + (nx & 7);
					y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
					y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

					{
						const uint8_t* pMuls = &s_muls[row & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d0[0] = clamp(y_sample0 + rc);
						d0[1] = clamp(y_sample0 + gc);
						d0[2] = clamp(y_sample0 + bc);
						d0[3] = 255;

						d0 += 4;
					}

					{
						const uint8_t* pMuls = &s_muls[(row + 1) & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d1[0] = clamp(y_sample1 + rc);
						d1[1] = clamp(y_sample1 + gc);
						d1[2] = clamp(y_sample1 + bc);
						d1[3] = 255;

						d1 += 4;
					}

					++x;
				}
			}

			return 2;
		}
		else
		{
			for (int x = 0; x < m_image_x_size; x++)
			{
				int y_sample = p_YSamples[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + y_sample_base_ofs)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
				int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
				int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				d0[0] = clamp(y_sample + rc);
				d0[1] = clamp(y_sample + gc);
				d0[2] = clamp(y_sample + bc);
				d0[3] = 255;

				d0 += 4;
			}

			return 1;
		}
	}